

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O1

void __thiscall deqp::egl::MakeCurrentPerfCase::destroyContexts(MakeCurrentPerfCase *this)

{
  EGLDisplay pvVar1;
  deUint32 err;
  Library *pLVar2;
  pointer ppvVar3;
  iterator iter;
  pointer ppvVar4;
  
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  ppvVar4 = (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar4) {
    ppvVar3 = (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppvVar4 != ppvVar3) {
      pvVar1 = this->m_display;
      do {
        if (*ppvVar4 != (void *)0x0) {
          (*pLVar2->_vptr_Library[0x13])(pLVar2,pvVar1);
          err = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
          eglu::checkError(err,"destroyContext(display, *iter)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                           ,400);
        }
        *ppvVar4 = (void *)0x0;
        ppvVar4 = ppvVar4 + 1;
        ppvVar3 = (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      } while (ppvVar4 != ppvVar3);
    }
    ppvVar4 = (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppvVar3 != ppvVar4) {
      (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppvVar4;
    }
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::destroyContexts (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();
	if (m_contexts.size() > 0)
	{
		EGLDisplay display = m_display;

		for (vector<EGLContext>::iterator iter = m_contexts.begin(); iter != m_contexts.end(); ++iter)
		{
			if (*iter != EGL_NO_CONTEXT)
				EGLU_CHECK_CALL(egl, destroyContext(display, *iter));
			*iter = EGL_NO_CONTEXT;
		}

		m_contexts.clear();
	}
}